

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O3

void __thiscall Assimp::DeboneProcess::Execute(DeboneProcess *this,aiScene *pScene)

{
  vector<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
  *this_00;
  vector<std::pair<unsigned_int,aiNode*>,std::allocator<std::pair<unsigned_int,aiNode*>>> *pvVar1;
  iterator iVar2;
  aiMesh *paVar3;
  bool bVar4;
  Logger *pLVar5;
  aiMesh **__dest;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  uint uVar19;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  aiMesh *srcMesh;
  vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
  newMeshes;
  pair<unsigned_int,_aiNode_*> push_pair;
  undefined1 local_248 [16];
  aiMesh **local_238;
  aiMesh *local_230;
  undefined1 local_228 [16];
  pointer local_218;
  aiScene *local_210;
  long *local_208 [2];
  long local_1f8 [2];
  DeboneProcess *local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  vector<bool,_std::allocator<bool>_> local_1d0;
  pair<unsigned_int,_aiNode_*> local_1a8 [7];
  ios_base local_138 [264];
  
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"DeboneProcess begin");
  if ((ulong)pScene->mNumMeshes != 0) {
    local_1a8[0].first = local_1a8[0].first & 0xffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_1d0,(ulong)pScene->mNumMeshes,(bool *)local_1a8,(allocator_type *)local_208);
    if (pScene->mNumMeshes == 0) {
      uVar9 = 0;
    }
    else {
      uVar10 = 0;
      do {
        bVar4 = ConsiderMesh(this,pScene->mMeshes[uVar10]);
        uVar7 = uVar10 >> 6;
        uVar8 = 1L << ((byte)uVar10 & 0x3f);
        if (bVar4) {
          uVar8 = uVar8 | local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7];
        }
        else {
          uVar8 = ~uVar8 & local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7];
        }
        local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar7] = uVar8;
        uVar10 = uVar10 + 1;
        uVar9 = pScene->mNumMeshes;
      } while (uVar10 < uVar9);
    }
    if ((this->mNumBonesCanDoWithout != 0) &&
       (uVar9 != 0 && (this->mNumBonesCanDoWithout != this->mNumBones & this->mAllOrNone) == 0)) {
      auVar11._4_4_ = uVar9 - 1;
      auVar11._0_4_ = uVar9 - 1;
      auVar11._8_8_ = 0;
      uVar6 = 0;
      auVar11 = auVar11 ^ _DAT_0065b2a0;
      auVar15 = ZEXT816(0x100000000);
      auVar13 = (undefined1  [16])0x0;
      do {
        auVar16 = auVar13;
        auVar13 = auVar15 ^ _DAT_0065b2a0;
        auVar14._0_4_ = -(uint)(auVar11._0_4_ < auVar13._0_4_);
        auVar14._4_4_ = -(uint)(auVar11._4_4_ < auVar13._4_4_);
        auVar14._8_4_ = -(uint)(auVar11._8_4_ < auVar13._8_4_);
        auVar14._12_4_ = -(uint)(auVar11._12_4_ < auVar13._12_4_);
        auVar17 = auVar16;
        if ((~auVar14._0_4_ & 1) != 0) {
          auVar17._8_8_ = 0;
          auVar17._0_8_ =
               local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[uVar6 >> 6];
        }
        if ((((ushort)auVar14._4_4_ ^ 0xffff) & 1) != 0) {
          auVar17._8_8_ =
               local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[uVar6 >> 6];
        }
        uVar10 = 1L << (ulong)SUB164(auVar15 & _DAT_006966e0,0) & auVar17._0_8_;
        uVar7 = 1L << (SUB168(auVar15 & _DAT_006966e0,8) >> 0x20) & auVar17._8_8_;
        uVar18 = -(uint)((int)uVar7 == 0);
        uVar19 = -(uint)((int)(uVar7 >> 0x20) == 0);
        auVar13._0_4_ = (auVar16._0_4_ - (uint)((int)uVar10 == 0 && (int)(uVar10 >> 0x20) == 0)) + 1
        ;
        auVar13._4_4_ = (uVar18 & uVar19) + auVar16._4_4_ + 1;
        auVar13._8_4_ = (uVar18 & uVar19) + auVar16._8_4_ + 1;
        auVar13._12_4_ = (uVar19 & uVar18) + auVar16._12_4_ + 1;
        uVar6 = uVar6 + 2;
        auVar12._0_4_ = auVar15._0_4_ + 2;
        auVar12._4_4_ = auVar15._4_4_ + 2;
        auVar12._8_4_ = auVar15._8_4_;
        auVar12._12_4_ = auVar15._12_4_;
        auVar15 = auVar12;
      } while ((uVar9 + 1 & 0xfffffffe) != uVar6);
      auVar15 = ~auVar14 & auVar13 | auVar16 & auVar14;
      if (auVar15._4_4_ + auVar15._0_4_ != 0) {
        this_00 = &this->mSubMeshIndices;
        std::
        vector<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
        ::resize(this_00,(ulong)uVar9);
        local_248 = (undefined1  [16])0x0;
        local_238 = (aiMesh **)0x0;
        if (pScene->mNumMeshes == 0) {
          uVar9 = 0;
        }
        else {
          uVar10 = 0;
          local_210 = pScene;
          local_1e8 = this;
          do {
            local_230 = local_210->mMeshes[uVar10];
            local_228 = (undefined1  [16])0x0;
            local_218 = (pointer)0x0;
            if ((local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar10 >> 6] >>
                 (uVar10 & 0x3f) & 1) == 0) {
LAB_00369c50:
              pvVar1 = (vector<std::pair<unsigned_int,aiNode*>,std::allocator<std::pair<unsigned_int,aiNode*>>>
                        *)((this_00->
                           super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar10);
              local_1a8[0].first = (uint)((ulong)(local_248._8_8_ - local_248._0_8_) >> 3);
              local_1a8[0].second = (aiNode *)0x0;
              iVar2._M_current = *(pair<unsigned_int,_aiNode_*> **)(pvVar1 + 8);
              if (iVar2._M_current == *(pair<unsigned_int,_aiNode_*> **)(pvVar1 + 0x10)) {
                std::
                vector<std::pair<unsigned_int,aiNode*>,std::allocator<std::pair<unsigned_int,aiNode*>>>
                ::_M_realloc_insert<std::pair<unsigned_int,aiNode*>>(pvVar1,iVar2,local_1a8);
              }
              else {
                *(ulong *)iVar2._M_current = CONCAT44(local_1a8[0]._4_4_,local_1a8[0].first);
                (iVar2._M_current)->second = (aiNode *)0x0;
                *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 0x10;
              }
              if ((aiMesh **)local_248._8_8_ == local_238) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)local_248,
                           (iterator)local_248._8_8_,&local_230);
              }
              else {
                *(aiMesh **)local_248._8_8_ = local_230;
                local_248._8_8_ = (aiMesh **)(local_248._8_8_ + 8);
              }
            }
            else {
              SplitMesh(this,local_230,
                        (vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                         *)local_228);
              if (local_228._0_8_ == local_228._8_8_) goto LAB_00369c50;
              local_1e0 = (ulong)local_230->mNumBones;
              uVar7 = 0;
              uVar9 = 1;
              local_1d8 = uVar10;
              do {
                if (((pointer)(local_228._0_8_ + uVar7 * 0x10))->second == (aiBone *)0x0) {
                  local_1a8[0].second = (aiNode *)0x0;
                }
                else {
                  local_1a8[0].second =
                       aiNode::FindNode(local_210->mRootNode,
                                        (((pointer)(local_228._0_8_ + uVar7 * 0x10))->second->mName)
                                        .data);
                }
                local_1a8[0].first = (uint)((ulong)(local_248._8_8_ - local_248._0_8_) >> 3);
                pvVar1 = (vector<std::pair<unsigned_int,aiNode*>,std::allocator<std::pair<unsigned_int,aiNode*>>>
                          *)((this_00->
                             super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar10);
                iVar2._M_current = *(pair<unsigned_int,_aiNode_*> **)(pvVar1 + 8);
                if (iVar2._M_current == *(pair<unsigned_int,_aiNode_*> **)(pvVar1 + 0x10)) {
                  std::
                  vector<std::pair<unsigned_int,aiNode*>,std::allocator<std::pair<unsigned_int,aiNode*>>>
                  ::_M_realloc_insert<std::pair<unsigned_int,aiNode*>const&>(pvVar1,iVar2,local_1a8)
                  ;
                }
                else {
                  *(ulong *)iVar2._M_current = CONCAT44(local_1a8[0]._4_4_,local_1a8[0].first);
                  (iVar2._M_current)->second = local_1a8[0].second;
                  *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 0x10;
                }
                if ((aiMesh **)local_248._8_8_ == local_238) {
                  std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                            ((vector<aiMesh*,std::allocator<aiMesh*>> *)local_248,
                             (iterator)local_248._8_8_,(aiMesh **)(local_228._0_8_ + uVar7 * 0x10));
                }
                else {
                  *(aiMesh **)local_248._8_8_ = ((pointer)(local_228._0_8_ + uVar7 * 0x10))->first;
                  local_248._8_8_ = (aiMesh **)(local_248._8_8_ + 8);
                }
                uVar7 = (ulong)uVar9;
                uVar9 = uVar9 + 1;
              } while (uVar7 < (ulong)((long)(local_228._8_8_ - local_228._0_8_) >> 4));
              bVar4 = DefaultLogger::isNullLogger();
              if (!bVar4) {
                pLVar5 = DefaultLogger::get();
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_formatter<char[31]>
                          ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8,(char (*) [31])"Removed %u bones. Input bones:");
                std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,". Output bones: ",0x10);
                std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__cxx11::stringbuf::str();
                Logger::info(pLVar5,(char *)local_208[0]);
                if (local_208[0] != local_1f8) {
                  operator_delete(local_208[0],local_1f8[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
              }
              paVar3 = local_230;
              if (local_230 != (aiMesh *)0x0) {
                aiMesh::~aiMesh(local_230);
              }
              operator_delete(paVar3,0x520);
              this = local_1e8;
              uVar10 = local_1d8;
            }
            if ((pointer)local_228._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_228._0_8_,(long)local_218 - local_228._0_8_);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < local_210->mNumMeshes);
          uVar9 = (uint)((ulong)(local_248._8_8_ - local_248._0_8_) >> 3);
          pScene = local_210;
        }
        pScene->mNumMeshes = uVar9;
        if (pScene->mMeshes != (aiMesh **)0x0) {
          operator_delete__(pScene->mMeshes);
          uVar9 = pScene->mNumMeshes;
        }
        __dest = (aiMesh **)operator_new__((ulong)uVar9 << 3);
        pScene->mMeshes = __dest;
        if (local_248._8_8_ - local_248._0_8_ != 0) {
          memmove(__dest,(void *)local_248._0_8_,local_248._8_8_ - local_248._0_8_);
        }
        UpdateNode(this,pScene->mRootNode);
        if ((void *)local_248._0_8_ != (void *)0x0) {
          operator_delete((void *)local_248._0_8_,(long)local_238 - local_248._0_8_);
        }
      }
    }
    pLVar5 = DefaultLogger::get();
    Logger::debug(pLVar5,"DeboneProcess end");
    if (local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_1d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  return;
}

Assistant:

void DeboneProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("DeboneProcess begin");

    if(!pScene->mNumMeshes) {
        return;
    }

    std::vector<bool> splitList(pScene->mNumMeshes);
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++) {
        splitList[a] = ConsiderMesh( pScene->mMeshes[a] );
    }

    int numSplits = 0;

    if(!!mNumBonesCanDoWithout && (!mAllOrNone||mNumBonesCanDoWithout==mNumBones))  {
        for(unsigned int a = 0; a < pScene->mNumMeshes; a++)    {
            if(splitList[a]) {
                numSplits++;
            }
        }
    }

    if(numSplits)   {
        // we need to do something. Let's go.
        //mSubMeshIndices.clear();                  // really needed?
        mSubMeshIndices.resize(pScene->mNumMeshes); // because we're doing it here anyway

        // build a new array of meshes for the scene
        std::vector<aiMesh*> meshes;

        for(unsigned int a=0;a<pScene->mNumMeshes;a++)
        {
            aiMesh* srcMesh = pScene->mMeshes[a];

            std::vector<std::pair<aiMesh*,const aiBone*> > newMeshes;

            if(splitList[a]) {
                SplitMesh(srcMesh,newMeshes);
            }

            // mesh was split
            if(!newMeshes.empty())  {
                unsigned int out = 0, in = srcMesh->mNumBones;

                // store new meshes and indices of the new meshes
                for(unsigned int b=0;b<newMeshes.size();b++)    {
                    const aiString *find = newMeshes[b].second?&newMeshes[b].second->mName:0;

                    aiNode *theNode = find?pScene->mRootNode->FindNode(*find):0;
                    std::pair<unsigned int,aiNode*> push_pair(static_cast<unsigned int>(meshes.size()),theNode);

                    mSubMeshIndices[a].push_back(push_pair);
                    meshes.push_back(newMeshes[b].first);

                    out+=newMeshes[b].first->mNumBones;
                }

                if(!DefaultLogger::isNullLogger()) {
                    ASSIMP_LOG_INFO_F("Removed %u bones. Input bones:", in - out, ". Output bones: ", out);
                }

                // and destroy the source mesh. It should be completely contained inside the new submeshes
                delete srcMesh;
            }
            else    {
                // Mesh is kept unchanged - store it's new place in the mesh array
                mSubMeshIndices[a].push_back(std::pair<unsigned int,aiNode*>(static_cast<unsigned int>(meshes.size()),(aiNode*)0));
                meshes.push_back(srcMesh);
            }
        }

        // rebuild the scene's mesh array
        pScene->mNumMeshes = static_cast<unsigned int>(meshes.size());
        delete [] pScene->mMeshes;
        pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
        std::copy( meshes.begin(), meshes.end(), pScene->mMeshes);

        // recurse through all nodes and translate the node's mesh indices to fit the new mesh array
        UpdateNode( pScene->mRootNode);
    }

    ASSIMP_LOG_DEBUG("DeboneProcess end");
}